

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_address_set_hostname(ENetAddress *address,char *name)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  sockaddr_in6 *sin_1;
  sockaddr_in *sin;
  addrinfo *result;
  addrinfo *resultList;
  addrinfo hints;
  char *name_local;
  ENetAddress *address_local;
  
  result = (addrinfo *)0x0;
  hints.ai_next = (addrinfo *)name;
  memset(&resultList,0,0x30);
  resultList._4_4_ = 0;
  iVar3 = getaddrinfo((char *)hints.ai_next,(char *)0x0,(addrinfo *)&resultList,(addrinfo **)&result
                     );
  if (iVar3 == 0) {
    for (sin = (sockaddr_in *)result; sin != (sockaddr_in *)0x0;
        sin = *(sockaddr_in **)sin[2].sin_zero) {
      if ((*(long *)sin[1].sin_zero != 0) &&
         (uVar1._0_2_ = sin[1].sin_family, uVar1._2_2_ = sin[1].sin_port, 0xf < uVar1)) {
        if ((sin->sin_addr).s_addr == 2) {
          lVar2 = *(long *)sin[1].sin_zero;
          memset(address,0,10);
          (address->field_0).ipv4.ffff = 0xffff;
          (address->field_0).ipv4.ip.s_addr = *(in_addr_t *)(lVar2 + 4);
          freeaddrinfo((addrinfo *)result);
          return 0;
        }
        if ((sin->sin_addr).s_addr == 10) {
          lVar2 = *(long *)sin[1].sin_zero;
          *(undefined8 *)&address->field_0 = *(undefined8 *)(lVar2 + 8);
          *(undefined8 *)((long)&address->field_0 + 8) = *(undefined8 *)(lVar2 + 0x10);
          freeaddrinfo((addrinfo *)result);
          return 0;
        }
      }
    }
    if (result != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)result);
    }
    address_local._4_4_ = enet_address_set_ip(address,(char *)hints.ai_next);
  }
  else {
    address_local._4_4_ = -1;
  }
  return address_local._4_4_;
}

Assistant:

int enet_address_set_hostname(ENetAddress* address, const char* name) {
	struct addrinfo hints, * resultList = NULL, * result = NULL;

	memset(&hints, 0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;

	if (getaddrinfo(name, NULL, &hints, &resultList) != 0) {
		ENET_LOG_ERROR("Getaddrinfo() returned an error");
		return -1;
	}

	for (result = resultList; result != NULL; result = result->ai_next) {
		if (result->ai_addr != NULL && result->ai_addrlen >= sizeof(struct sockaddr_in)) {
			if (result->ai_family == AF_INET) {
				struct sockaddr_in* sin = (struct sockaddr_in*)result->ai_addr;

				memset(address, 0, sizeof(address->ipv4.zeros));

				address->ipv4.ffff = 0xFFFF;
				address->ipv4.ip.s_addr = sin->sin_addr.s_addr;

				freeaddrinfo(resultList);

				return 0;
			}
			else if (result->ai_family == AF_INET6) {
				struct sockaddr_in6* sin = (struct sockaddr_in6*)result->ai_addr;

				address->ipv6 = sin->sin6_addr;

				freeaddrinfo(resultList);

				return 0;
			}
		}
	}

	if (resultList != NULL)
		freeaddrinfo(resultList);

	return enet_address_set_ip(address, name);
}